

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void anon_unknown.dwarf_160201::initNumberSkeletons(UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  void *__dest;
  char16_t *__src;
  size_t numBytes;
  UnicodeString result;
  UnicodeString local_c10;
  UnicodeString local_bd0;
  UnicodeString local_b90;
  UnicodeString local_b50;
  UnicodeString local_b10;
  UnicodeString local_ad0;
  UnicodeString local_a90;
  UnicodeString local_a50;
  UnicodeString local_a10;
  UnicodeString local_9d0;
  UnicodeString local_990;
  UnicodeString local_950;
  UnicodeString local_910;
  UnicodeString local_8d0;
  UnicodeString local_890;
  UnicodeString local_850;
  UnicodeString local_810;
  UnicodeString local_7d0;
  UnicodeString local_790;
  UnicodeString local_750;
  UnicodeString local_710;
  UnicodeString local_6d0;
  UnicodeString local_690;
  UnicodeString local_650;
  UnicodeString local_610;
  UnicodeString local_5d0;
  UnicodeString local_590;
  UnicodeString local_550;
  UnicodeString local_510;
  UnicodeString local_4d0;
  UnicodeString local_490;
  UnicodeString local_450;
  UnicodeString local_410;
  UnicodeString local_3d0;
  UnicodeString local_390;
  UnicodeString local_350;
  UnicodeString local_310;
  UnicodeString local_2d0;
  UnicodeString local_290;
  UnicodeString local_250;
  UnicodeString local_210;
  UnicodeString local_1d0;
  UnicodeString local_190;
  UnicodeString local_150;
  UnicodeString local_110;
  UnicodeString local_d0;
  uint local_90;
  undefined1 local_80 [8];
  UCharsTrieBuilder b;
  UErrorCode *status_local;
  
  b._104_8_ = status;
  ucln_i18n_registerCleanup_63(UCLN_I18N_NUMBER_SKELETONS,cleanupNumberSkeletons);
  icu_63::UCharsTrieBuilder::UCharsTrieBuilder
            ((UCharsTrieBuilder *)local_80,(UErrorCode *)b._104_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)b._104_8_);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::UnicodeString(&local_d0,L"compact-short");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_d0,0,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_d0);
    icu_63::UnicodeString::UnicodeString(&local_110,L"compact-long");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_110,1,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_110);
    icu_63::UnicodeString::UnicodeString(&local_150,L"scientific");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_150,2,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_150);
    icu_63::UnicodeString::UnicodeString(&local_190,L"engineering");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_190,3,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_190);
    icu_63::UnicodeString::UnicodeString(&local_1d0,L"notation-simple");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_1d0,4,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_1d0);
    icu_63::UnicodeString::UnicodeString(&local_210,L"base-unit");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_210,5,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_210);
    icu_63::UnicodeString::UnicodeString(&local_250,L"percent");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_250,6,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_250);
    icu_63::UnicodeString::UnicodeString(&local_290,L"permille");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_290,7,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_290);
    icu_63::UnicodeString::UnicodeString(&local_2d0,L"precision-integer");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_2d0,8,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_2d0);
    icu_63::UnicodeString::UnicodeString(&local_310,L"precision-unlimited");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_310,9,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_310);
    icu_63::UnicodeString::UnicodeString(&local_350,L"precision-currency-standard");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_350,10,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_350);
    icu_63::UnicodeString::UnicodeString(&local_390,L"precision-currency-cash");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_390,0xb,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_390);
    icu_63::UnicodeString::UnicodeString(&local_3d0,L"rounding-mode-ceiling");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_3d0,0xc,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_3d0);
    icu_63::UnicodeString::UnicodeString(&local_410,L"rounding-mode-floor");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_410,0xd,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_410);
    icu_63::UnicodeString::UnicodeString(&local_450,L"rounding-mode-down");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_450,0xe,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_450);
    icu_63::UnicodeString::UnicodeString(&local_490,L"rounding-mode-up");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_490,0xf,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_490);
    icu_63::UnicodeString::UnicodeString(&local_4d0,L"rounding-mode-half-even");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_4d0,0x10,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_4d0);
    icu_63::UnicodeString::UnicodeString(&local_510,L"rounding-mode-half-down");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_510,0x11,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_510);
    icu_63::UnicodeString::UnicodeString(&local_550,L"rounding-mode-half-up");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_550,0x12,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_550);
    icu_63::UnicodeString::UnicodeString(&local_590,L"rounding-mode-unnecessary");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_590,0x13,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_590);
    icu_63::UnicodeString::UnicodeString(&local_5d0,L"group-off");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_5d0,0x14,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_5d0);
    icu_63::UnicodeString::UnicodeString(&local_610,L"group-min2");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_610,0x15,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_610);
    icu_63::UnicodeString::UnicodeString(&local_650,L"group-auto");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_650,0x16,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_650);
    icu_63::UnicodeString::UnicodeString(&local_690,L"group-on-aligned");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_690,0x17,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_690);
    icu_63::UnicodeString::UnicodeString(&local_6d0,L"group-thousands");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_6d0,0x18,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_6d0);
    icu_63::UnicodeString::UnicodeString(&local_710,L"latin");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_710,0x19,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_710);
    icu_63::UnicodeString::UnicodeString(&local_750,L"unit-width-narrow");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_750,0x1a,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_750);
    icu_63::UnicodeString::UnicodeString(&local_790,L"unit-width-short");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_790,0x1b,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_790);
    icu_63::UnicodeString::UnicodeString(&local_7d0,L"unit-width-full-name");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_7d0,0x1c,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_7d0);
    icu_63::UnicodeString::UnicodeString(&local_810,L"unit-width-iso-code");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_810,0x1d,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_810);
    icu_63::UnicodeString::UnicodeString(&local_850,L"unit-width-hidden");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_850,0x1e,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_850);
    icu_63::UnicodeString::UnicodeString(&local_890,L"sign-auto");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_890,0x1f,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_890);
    icu_63::UnicodeString::UnicodeString(&local_8d0,L"sign-always");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_8d0,0x20,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_8d0);
    icu_63::UnicodeString::UnicodeString(&local_910,L"sign-never");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_910,0x21,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_910);
    icu_63::UnicodeString::UnicodeString(&local_950,L"sign-accounting");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_950,0x22,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_950);
    icu_63::UnicodeString::UnicodeString(&local_990,L"sign-accounting-always");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_990,0x23,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_990);
    icu_63::UnicodeString::UnicodeString(&local_9d0,L"sign-except-zero");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_9d0,0x24,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_9d0);
    icu_63::UnicodeString::UnicodeString(&local_a10,L"sign-accounting-except-zero");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_a10,0x25,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_a10);
    icu_63::UnicodeString::UnicodeString(&local_a50,L"decimal-auto");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_a50,0x26,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_a50);
    icu_63::UnicodeString::UnicodeString(&local_a90,L"decimal-always");
    icu_63::UCharsTrieBuilder::add
              ((UCharsTrieBuilder *)local_80,&local_a90,0x27,(UErrorCode *)b._104_8_);
    icu_63::UnicodeString::~UnicodeString(&local_a90);
    UVar1 = ::U_FAILURE(*(UErrorCode *)b._104_8_);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::UnicodeString(&local_ad0,L"precision-increment");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_ad0,0x28,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_ad0);
      icu_63::UnicodeString::UnicodeString(&local_b10,L"measure-unit");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_b10,0x29,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_b10);
      icu_63::UnicodeString::UnicodeString(&local_b50,L"per-measure-unit");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_b50,0x2a,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_b50);
      icu_63::UnicodeString::UnicodeString(&local_b90,L"currency");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_b90,0x2b,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_b90);
      icu_63::UnicodeString::UnicodeString(&local_bd0,L"integer-width");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_bd0,0x2c,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_bd0);
      icu_63::UnicodeString::UnicodeString(&local_c10,L"numbering-system");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,&local_c10,0x2d,(UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString(&local_c10);
      icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&result.fUnion + 0x30),L"scale");
      icu_63::UCharsTrieBuilder::add
                ((UCharsTrieBuilder *)local_80,(UnicodeString *)((long)&result.fUnion + 0x30),0x2e,
                 (UErrorCode *)b._104_8_);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&result.fUnion + 0x30));
      UVar1 = ::U_FAILURE(*(UErrorCode *)b._104_8_);
      if (UVar1 == '\0') {
        icu_63::UnicodeString::UnicodeString((UnicodeString *)&numBytes);
        icu_63::UCharsTrieBuilder::buildUnicodeString
                  ((UCharsTrieBuilder *)local_80,USTRINGTRIE_BUILD_FAST,(UnicodeString *)&numBytes,
                   (UErrorCode *)b._104_8_);
        UVar1 = ::U_FAILURE(*(UErrorCode *)b._104_8_);
        if (UVar1 == '\0') {
          iVar2 = icu_63::UnicodeString::length((UnicodeString *)&numBytes);
          __dest = uprv_malloc_63((long)iVar2 * 2);
          (anonymous_namespace)::kSerializedStemTrie = __dest;
          __src = icu_63::UnicodeString::getBuffer((UnicodeString *)&numBytes);
          memcpy(__dest,__src,(long)iVar2 * 2);
        }
        local_90 = (uint)(UVar1 != '\0');
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&numBytes);
      }
      else {
        local_90 = 1;
      }
    }
    else {
      local_90 = 1;
    }
  }
  else {
    local_90 = 1;
  }
  icu_63::UCharsTrieBuilder::~UCharsTrieBuilder((UCharsTrieBuilder *)local_80);
  return;
}

Assistant:

void U_CALLCONV initNumberSkeletons(UErrorCode& status) {
    ucln_i18n_registerCleanup(UCLN_I18N_NUMBER_SKELETONS, cleanupNumberSkeletons);

    UCharsTrieBuilder b(status);
    if (U_FAILURE(status)) { return; }

    // Section 1:
    b.add(u"compact-short", STEM_COMPACT_SHORT, status);
    b.add(u"compact-long", STEM_COMPACT_LONG, status);
    b.add(u"scientific", STEM_SCIENTIFIC, status);
    b.add(u"engineering", STEM_ENGINEERING, status);
    b.add(u"notation-simple", STEM_NOTATION_SIMPLE, status);
    b.add(u"base-unit", STEM_BASE_UNIT, status);
    b.add(u"percent", STEM_PERCENT, status);
    b.add(u"permille", STEM_PERMILLE, status);
    b.add(u"precision-integer", STEM_PRECISION_INTEGER, status);
    b.add(u"precision-unlimited", STEM_PRECISION_UNLIMITED, status);
    b.add(u"precision-currency-standard", STEM_PRECISION_CURRENCY_STANDARD, status);
    b.add(u"precision-currency-cash", STEM_PRECISION_CURRENCY_CASH, status);
    b.add(u"rounding-mode-ceiling", STEM_ROUNDING_MODE_CEILING, status);
    b.add(u"rounding-mode-floor", STEM_ROUNDING_MODE_FLOOR, status);
    b.add(u"rounding-mode-down", STEM_ROUNDING_MODE_DOWN, status);
    b.add(u"rounding-mode-up", STEM_ROUNDING_MODE_UP, status);
    b.add(u"rounding-mode-half-even", STEM_ROUNDING_MODE_HALF_EVEN, status);
    b.add(u"rounding-mode-half-down", STEM_ROUNDING_MODE_HALF_DOWN, status);
    b.add(u"rounding-mode-half-up", STEM_ROUNDING_MODE_HALF_UP, status);
    b.add(u"rounding-mode-unnecessary", STEM_ROUNDING_MODE_UNNECESSARY, status);
    b.add(u"group-off", STEM_GROUP_OFF, status);
    b.add(u"group-min2", STEM_GROUP_MIN2, status);
    b.add(u"group-auto", STEM_GROUP_AUTO, status);
    b.add(u"group-on-aligned", STEM_GROUP_ON_ALIGNED, status);
    b.add(u"group-thousands", STEM_GROUP_THOUSANDS, status);
    b.add(u"latin", STEM_LATIN, status);
    b.add(u"unit-width-narrow", STEM_UNIT_WIDTH_NARROW, status);
    b.add(u"unit-width-short", STEM_UNIT_WIDTH_SHORT, status);
    b.add(u"unit-width-full-name", STEM_UNIT_WIDTH_FULL_NAME, status);
    b.add(u"unit-width-iso-code", STEM_UNIT_WIDTH_ISO_CODE, status);
    b.add(u"unit-width-hidden", STEM_UNIT_WIDTH_HIDDEN, status);
    b.add(u"sign-auto", STEM_SIGN_AUTO, status);
    b.add(u"sign-always", STEM_SIGN_ALWAYS, status);
    b.add(u"sign-never", STEM_SIGN_NEVER, status);
    b.add(u"sign-accounting", STEM_SIGN_ACCOUNTING, status);
    b.add(u"sign-accounting-always", STEM_SIGN_ACCOUNTING_ALWAYS, status);
    b.add(u"sign-except-zero", STEM_SIGN_EXCEPT_ZERO, status);
    b.add(u"sign-accounting-except-zero", STEM_SIGN_ACCOUNTING_EXCEPT_ZERO, status);
    b.add(u"decimal-auto", STEM_DECIMAL_AUTO, status);
    b.add(u"decimal-always", STEM_DECIMAL_ALWAYS, status);
    if (U_FAILURE(status)) { return; }

    // Section 2:
    b.add(u"precision-increment", STEM_PRECISION_INCREMENT, status);
    b.add(u"measure-unit", STEM_MEASURE_UNIT, status);
    b.add(u"per-measure-unit", STEM_PER_MEASURE_UNIT, status);
    b.add(u"currency", STEM_CURRENCY, status);
    b.add(u"integer-width", STEM_INTEGER_WIDTH, status);
    b.add(u"numbering-system", STEM_NUMBERING_SYSTEM, status);
    b.add(u"scale", STEM_SCALE, status);
    if (U_FAILURE(status)) { return; }

    // Build the CharsTrie
    // TODO: Use SLOW or FAST here?
    UnicodeString result;
    b.buildUnicodeString(USTRINGTRIE_BUILD_FAST, result, status);
    if (U_FAILURE(status)) { return; }

    // Copy the result into the global constant pointer
    size_t numBytes = result.length() * sizeof(char16_t);
    kSerializedStemTrie = static_cast<char16_t*>(uprv_malloc(numBytes));
    uprv_memcpy(kSerializedStemTrie, result.getBuffer(), numBytes);
}